

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O0

MyGame_Example_Any_union_ref_t
MyGame_Example_Any_clone(flatbuffers_builder_t *B,MyGame_Example_Any_union_t u)

{
  MyGame_Example_Monster_ref_t ref;
  MyGame_Example_TestSimpleTableWithEnum_ref_t ref_00;
  MyGame_Example2_Monster_ref_t ref_01;
  MyGame_Example_Alt_ref_t ref_02;
  MyGame_Example_Monster_table_t t;
  flatbuffers_builder_t *B_local;
  MyGame_Example_Any_union_t u_local;
  
  t = (MyGame_Example_Monster_table_t)u.value;
  switch(u.type) {
  case '\x01':
    ref = MyGame_Example_Monster_clone(B,t);
    u_local.value = (flatbuffers_generic_t)MyGame_Example_Any_as_Monster(ref);
    break;
  case '\x02':
    ref_00 = MyGame_Example_TestSimpleTableWithEnum_clone
                       (B,(MyGame_Example_TestSimpleTableWithEnum_table_t)t);
    u_local.value = (flatbuffers_generic_t)MyGame_Example_Any_as_TestSimpleTableWithEnum(ref_00);
    break;
  case '\x03':
    ref_01 = MyGame_Example2_Monster_clone(B,(MyGame_Example2_Monster_table_t)t);
    u_local.value = (flatbuffers_generic_t)MyGame_Example_Any_as_Monster2(ref_01);
    break;
  case '\x04':
    ref_02 = MyGame_Example_Alt_clone(B,(MyGame_Example_Alt_table_t)t);
    u_local.value = (flatbuffers_generic_t)MyGame_Example_Any_as_Alt(ref_02);
    break;
  default:
    u_local.value = (flatbuffers_generic_t)MyGame_Example_Any_as_NONE();
  }
  return (MyGame_Example_Any_union_ref_t)u_local.value;
}

Assistant:

static MyGame_Example_Any_union_ref_t MyGame_Example_Any_clone(flatbuffers_builder_t *B, MyGame_Example_Any_union_t u)
{
    switch (u.type) {
    case 1: return MyGame_Example_Any_as_Monster(MyGame_Example_Monster_clone(B, (MyGame_Example_Monster_table_t)u.value));
    case 2: return MyGame_Example_Any_as_TestSimpleTableWithEnum(MyGame_Example_TestSimpleTableWithEnum_clone(B, (MyGame_Example_TestSimpleTableWithEnum_table_t)u.value));
    case 3: return MyGame_Example_Any_as_Monster2(MyGame_Example2_Monster_clone(B, (MyGame_Example2_Monster_table_t)u.value));
    case 4: return MyGame_Example_Any_as_Alt(MyGame_Example_Alt_clone(B, (MyGame_Example_Alt_table_t)u.value));
    default: return MyGame_Example_Any_as_NONE();
    }
}